

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

slot_type * __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
::soo_slot(raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
           *this)

{
  bool bVar1;
  CommonFields *this_00;
  slot_type *psVar2;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *this_local;
  
  bVar1 = is_soo(this);
  if (!bVar1) {
    __assert_fail("(is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x101f,
                  "slot_type *absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, int>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, int>>>::soo_slot() [Policy = absl::container_internal::FlatHashMapPolicy<int, int>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, int>>]"
                 );
  }
  this_00 = common(this);
  psVar2 = (slot_type *)CommonFields::soo_data(this_00);
  return psVar2;
}

Assistant:

slot_type* soo_slot() {
    ABSL_SWISSTABLE_ASSERT(is_soo());
    return static_cast<slot_type*>(common().soo_data());
  }